

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

void relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
               (queue<int,_std::deque<int,_std::allocator<int>_>_> *t1,char *s1,
               queue<int,_std::deque<int,_std::allocator<int>_>_> *t2,char *s2)

{
  _Map_pointer ppiVar1;
  _Elt_pointer piVar2;
  _Map_pointer ppiVar3;
  _Map_pointer ppiVar4;
  _Elt_pointer piVar5;
  char *pcVar6;
  bool bVar7;
  size_t sVar8;
  long lVar9;
  _Elt_pointer piVar10;
  ulong uVar11;
  _Elt_pointer piVar12;
  _Map_pointer ppiVar13;
  ulong uVar14;
  long lVar15;
  _Elt_pointer piVar16;
  int iVar17;
  _Elt_pointer piVar18;
  _Elt_pointer piVar19;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_d8;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_b8;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_98;
  char *local_78;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_70;
  _Map_pointer local_68;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_50;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Map_pointer local_38;
  
  local_78 = s2;
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c098);
  }
  else {
    sVar8 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  ppiVar13 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  ppiVar1 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  piVar18 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur;
  piVar16 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first;
  piVar2 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar12 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_last;
  ppiVar3 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  ppiVar4 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  piVar5 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar10 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_last;
  local_50 = t1;
  if (((long)piVar12 - (long)piVar2 >> 2) + ((long)piVar18 - (long)piVar16 >> 2) +
      ((((ulong)((long)ppiVar13 - (long)ppiVar1) >> 3) - 1) + (ulong)(ppiVar13 == (_Map_pointer)0x0)
      ) * 0x80 ==
      ((long)piVar10 - (long)piVar5 >> 2) +
      ((long)(t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur -
       (long)(t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 2) +
      ((((ulong)((long)ppiVar3 - (long)ppiVar4) >> 3) - 1) + (ulong)(ppiVar3 == (_Map_pointer)0x0))
      * 0x80) {
    local_b8._M_first =
         (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_98._M_last =
         (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_d8._M_first =
         (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_d8._M_cur = piVar5;
    local_d8._M_last = piVar10;
    local_d8._M_node = ppiVar4;
    local_b8._M_cur = piVar2;
    local_b8._M_last = piVar12;
    local_b8._M_node = ppiVar1;
    local_98._M_cur = piVar18;
    local_98._M_first = piVar16;
    local_98._M_node = ppiVar13;
    bVar7 = std::
            __equal_dit<int,int_const&,int_const*,std::_Deque_iterator<int,int_const&,int_const*>>
                      (&local_b8,&local_98,&local_d8);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
    }
  }
  ppiVar13 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  ppiVar1 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  piVar18 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  piVar16 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first;
  piVar2 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  piVar12 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppiVar3 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  ppiVar4 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  piVar5 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar10 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_last;
  piVar19 = (_Elt_pointer)
            (((((ulong)((long)ppiVar3 - (long)ppiVar4) >> 3) - 1) +
             (ulong)(ppiVar3 == (_Map_pointer)0x0)) * 0x80);
  if (((long)piVar12 - (long)piVar2 >> 2) + ((long)piVar18 - (long)piVar16 >> 2) +
      ((((ulong)((long)ppiVar13 - (long)ppiVar1) >> 3) - 1) + (ulong)(ppiVar13 == (_Map_pointer)0x0)
      ) * 0x80 ==
      ((long)piVar10 - (long)piVar5 >> 2) +
      ((long)(t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur -
       (long)(t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_first >> 2) + (long)piVar19) {
    piVar19 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_d8._M_first =
         (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_d8._M_cur = piVar5;
    local_d8._M_last = piVar10;
    local_d8._M_node = ppiVar4;
    local_b8._M_cur = piVar2;
    local_b8._M_first = piVar19;
    local_b8._M_last = piVar12;
    local_b8._M_node = ppiVar1;
    local_98._M_cur = piVar18;
    local_98._M_first = piVar16;
    local_98._M_node = ppiVar13;
    bVar7 = std::
            __equal_dit<int,int_const&,int_const*,std::_Deque_iterator<int,int_const&,int_const*>>
                      (&local_b8,&local_98,&local_d8);
    if (bVar7) goto LAB_00103e35;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
LAB_00103e35:
  piVar16 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  local_48 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_38 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar2 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_60 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar12 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur;
  local_58 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_first;
  piVar18 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_last;
  ppiVar13 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  piVar5 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  local_68 = (t2->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  do {
    if (piVar16 == piVar2) {
      piVar10 = (_Elt_pointer)(ulong)(piVar5 != piVar12);
      break;
    }
    piVar10 = piVar18;
    if (ppiVar13 == local_68) {
      piVar10 = piVar5;
    }
    if ((long)piVar10 - (long)piVar12 == 0) {
      bVar7 = false;
      piVar19 = (_Elt_pointer)0x0;
    }
    else {
      lVar9 = (long)piVar10 - (long)piVar12 >> 2;
      piVar10 = local_48;
      if (local_38 == local_60) {
        piVar10 = piVar2;
      }
      lVar15 = (long)piVar10 - (long)piVar16 >> 2;
      if (lVar9 < lVar15) {
        lVar15 = lVar9;
      }
      piVar10 = piVar12;
      if (lVar15 != 0) {
        lVar9 = 0;
        do {
          iVar17 = 1;
          if (lVar15 * 4 - lVar9 == 0) goto LAB_00103f1e;
          if (*(int *)((long)piVar16 + lVar9) < *(int *)((long)piVar12 + lVar9)) {
            iVar17 = -1;
            goto LAB_00103f1e;
          }
          if (*(int *)((long)piVar12 + lVar9) < *(int *)((long)piVar16 + lVar9)) goto LAB_00103f1e;
          lVar9 = lVar9 + 4;
        } while (lVar15 * 4 - lVar9 != 0);
        piVar10 = (_Elt_pointer)(lVar9 + (long)piVar12);
      }
      iVar17 = -(uint)(piVar10 != piVar12 + lVar15);
LAB_00103f1e:
      bVar7 = iVar17 == 0;
      piVar10 = (_Elt_pointer)((ulong)piVar19 & 0xff);
      piVar19 = (_Elt_pointer)(ulong)(iVar17 < 0);
      if (bVar7) {
        uVar11 = ((long)piVar16 - (long)local_40 >> 2) + lVar15;
        if (uVar11 < 0x80) {
          piVar16 = piVar16 + lVar15;
        }
        else {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          local_38 = local_38 + uVar14;
          local_40 = *local_38;
          local_48 = local_40 + 0x80;
          piVar16 = local_40 + uVar11 + uVar14 * -0x80;
        }
        uVar11 = lVar15 + ((long)piVar12 - (long)local_58 >> 2);
        bVar7 = true;
        piVar12 = piVar12 + lVar15;
        piVar19 = piVar10;
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          ppiVar13 = ppiVar13 + uVar14;
          local_58 = *ppiVar13;
          piVar18 = local_58 + 0x80;
          piVar12 = local_58 + uVar11 + uVar14 * -0x80;
        }
      }
    }
    piVar10 = piVar19;
  } while (bVar7);
  local_70 = t2;
  if (((ulong)piVar10 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  piVar16 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  local_48 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_38 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar2 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_60 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar12 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_58 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  piVar18 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppiVar13 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar5 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_68 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  do {
    if (piVar16 == piVar2) {
      piVar10 = (_Elt_pointer)(ulong)(piVar5 != piVar12);
      break;
    }
    piVar10 = piVar18;
    if (ppiVar13 == local_68) {
      piVar10 = piVar5;
    }
    if ((long)piVar10 - (long)piVar12 == 0) {
      bVar7 = false;
      piVar19 = (_Elt_pointer)0x0;
    }
    else {
      lVar9 = (long)piVar10 - (long)piVar12 >> 2;
      piVar10 = local_48;
      if (local_38 == local_60) {
        piVar10 = piVar2;
      }
      lVar15 = (long)piVar10 - (long)piVar16 >> 2;
      if (lVar9 < lVar15) {
        lVar15 = lVar9;
      }
      piVar10 = piVar12;
      if (lVar15 != 0) {
        lVar9 = 0;
        do {
          iVar17 = 1;
          if (lVar15 * 4 - lVar9 == 0) goto LAB_00104135;
          if (*(int *)((long)piVar16 + lVar9) < *(int *)((long)piVar12 + lVar9)) {
            iVar17 = -1;
            goto LAB_00104135;
          }
          if (*(int *)((long)piVar12 + lVar9) < *(int *)((long)piVar16 + lVar9)) goto LAB_00104135;
          lVar9 = lVar9 + 4;
        } while (lVar15 * 4 - lVar9 != 0);
        piVar10 = (_Elt_pointer)(lVar9 + (long)piVar12);
      }
      iVar17 = -(uint)(piVar10 != piVar12 + lVar15);
LAB_00104135:
      bVar7 = iVar17 == 0;
      piVar10 = (_Elt_pointer)((ulong)piVar19 & 0xff);
      piVar19 = (_Elt_pointer)(ulong)(iVar17 < 0);
      if (bVar7) {
        uVar11 = ((long)piVar16 - (long)local_40 >> 2) + lVar15;
        if (uVar11 < 0x80) {
          piVar16 = piVar16 + lVar15;
        }
        else {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          local_38 = local_38 + uVar14;
          local_40 = *local_38;
          local_48 = local_40 + 0x80;
          piVar16 = local_40 + uVar11 + uVar14 * -0x80;
        }
        uVar11 = lVar15 + ((long)piVar12 - (long)local_58 >> 2);
        bVar7 = true;
        piVar12 = piVar12 + lVar15;
        piVar19 = piVar10;
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          ppiVar13 = ppiVar13 + uVar14;
          local_58 = *ppiVar13;
          piVar18 = local_58 + 0x80;
          piVar12 = local_58 + uVar11 + uVar14 * -0x80;
        }
      }
    }
    piVar10 = piVar19;
  } while (bVar7);
  if (((ulong)piVar10 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  piVar16 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  local_48 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_38 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar2 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_60 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar12 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_58 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  piVar18 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppiVar13 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar5 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_68 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  do {
    if (piVar16 == piVar2) {
      piVar10 = (_Elt_pointer)(ulong)(piVar5 != piVar12);
      break;
    }
    piVar10 = piVar18;
    if (ppiVar13 == local_68) {
      piVar10 = piVar5;
    }
    if ((long)piVar10 - (long)piVar12 == 0) {
      bVar7 = false;
      piVar19 = (_Elt_pointer)0x0;
    }
    else {
      lVar9 = (long)piVar10 - (long)piVar12 >> 2;
      piVar10 = local_48;
      if (local_38 == local_60) {
        piVar10 = piVar2;
      }
      lVar15 = (long)piVar10 - (long)piVar16 >> 2;
      if (lVar9 < lVar15) {
        lVar15 = lVar9;
      }
      piVar10 = piVar12;
      if (lVar15 != 0) {
        lVar9 = 0;
        do {
          iVar17 = 1;
          if (lVar15 * 4 - lVar9 == 0) goto LAB_0010434c;
          if (*(int *)((long)piVar16 + lVar9) < *(int *)((long)piVar12 + lVar9)) {
            iVar17 = -1;
            goto LAB_0010434c;
          }
          if (*(int *)((long)piVar12 + lVar9) < *(int *)((long)piVar16 + lVar9)) goto LAB_0010434c;
          lVar9 = lVar9 + 4;
        } while (lVar15 * 4 - lVar9 != 0);
        piVar10 = (_Elt_pointer)(lVar9 + (long)piVar12);
      }
      iVar17 = -(uint)(piVar10 != piVar12 + lVar15);
LAB_0010434c:
      bVar7 = iVar17 == 0;
      piVar10 = (_Elt_pointer)((ulong)piVar19 & 0xff);
      piVar19 = (_Elt_pointer)(ulong)(iVar17 < 0);
      if (bVar7) {
        uVar11 = ((long)piVar16 - (long)local_40 >> 2) + lVar15;
        if (uVar11 < 0x80) {
          piVar16 = piVar16 + lVar15;
        }
        else {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          local_38 = local_38 + uVar14;
          local_40 = *local_38;
          local_48 = local_40 + 0x80;
          piVar16 = local_40 + uVar11 + uVar14 * -0x80;
        }
        uVar11 = lVar15 + ((long)piVar12 - (long)local_58 >> 2);
        bVar7 = true;
        piVar12 = piVar12 + lVar15;
        piVar19 = piVar10;
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          ppiVar13 = ppiVar13 + uVar14;
          local_58 = *ppiVar13;
          piVar18 = local_58 + 0x80;
          piVar12 = local_58 + uVar11 + uVar14 * -0x80;
        }
      }
    }
    piVar10 = piVar19;
  } while (bVar7);
  if (((ulong)piVar10 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  piVar16 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  local_48 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_38 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar2 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_60 = (local_50->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar12 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_50 = (queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  piVar18 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppiVar13 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar5 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  local_68 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  do {
    if (piVar16 == piVar2) {
      piVar19 = (_Elt_pointer)(ulong)(piVar5 != piVar12);
      break;
    }
    piVar10 = piVar18;
    if (ppiVar13 == local_68) {
      piVar10 = piVar5;
    }
    if ((long)piVar10 - (long)piVar12 == 0) {
      bVar7 = false;
      piVar19 = (_Elt_pointer)0x0;
    }
    else {
      lVar9 = (long)piVar10 - (long)piVar12 >> 2;
      piVar10 = local_48;
      if (local_38 == local_60) {
        piVar10 = piVar2;
      }
      lVar15 = (long)piVar10 - (long)piVar16 >> 2;
      if (lVar9 < lVar15) {
        lVar15 = lVar9;
      }
      piVar10 = piVar12;
      if (lVar15 != 0) {
        lVar9 = 0;
        do {
          iVar17 = 1;
          if (lVar15 * 4 - lVar9 == 0) goto LAB_00104563;
          if (*(int *)((long)piVar16 + lVar9) < *(int *)((long)piVar12 + lVar9)) {
            iVar17 = -1;
            goto LAB_00104563;
          }
          if (*(int *)((long)piVar12 + lVar9) < *(int *)((long)piVar16 + lVar9)) goto LAB_00104563;
          lVar9 = lVar9 + 4;
        } while (lVar15 * 4 - lVar9 != 0);
        piVar10 = (_Elt_pointer)(lVar9 + (long)piVar12);
      }
      iVar17 = -(uint)(piVar10 != piVar12 + lVar15);
LAB_00104563:
      bVar7 = iVar17 == 0;
      piVar10 = (_Elt_pointer)((ulong)piVar19 & 0xff);
      piVar19 = (_Elt_pointer)(ulong)(iVar17 < 0);
      if (bVar7) {
        uVar11 = ((long)piVar16 - (long)local_40 >> 2) + lVar15;
        if (uVar11 < 0x80) {
          piVar16 = piVar16 + lVar15;
        }
        else {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          local_38 = local_38 + uVar14;
          local_40 = *local_38;
          local_48 = local_40 + 0x80;
          piVar16 = local_40 + uVar11 + uVar14 * -0x80;
        }
        uVar11 = lVar15 + ((long)piVar12 - (long)local_50 >> 2);
        bVar7 = true;
        piVar12 = piVar12 + lVar15;
        piVar19 = piVar10;
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar11) {
            uVar14 = uVar11 >> 7;
          }
          ppiVar13 = ppiVar13 + uVar14;
          local_50 = (queue<int,_std::deque<int,_std::allocator<int>_>_> *)*ppiVar13;
          piVar18 = (_Elt_pointer)((long)local_50 + 0x200);
          piVar12 = (_Elt_pointer)((long)local_50 + (uVar11 + uVar14 * -0x80) * 4);
        }
      }
    }
  } while (bVar7);
  if (((ulong)piVar19 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"greater than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  pcVar6 = local_78;
  if (local_78 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c098);
  }
  else {
    sVar8 = strlen(local_78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}